

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O3

string * __thiscall
flatbuffers::dart::DartGenerator::GenStructObjectAPI_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields)

{
  bool bVar1;
  FieldDef *pFVar2;
  Namespace *current_namespace;
  EnumDef *this_00;
  size_type sVar3;
  FieldDef *pFVar4;
  long *plVar5;
  EnumVal *v;
  size_type *psVar6;
  ulong *puVar7;
  long *plVar8;
  pointer ppVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  DartGenerator *this_01;
  string field_name;
  string defaultValue;
  string constructor_args;
  string type_name;
  string object_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180;
  ulong *local_160;
  long local_158;
  ulong local_150;
  long lStack_148;
  string local_140;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  DartGenerator *local_e0;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *local_d8;
  StructDef *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  IdlNamer *local_a8;
  string local_a0;
  pointer local_80;
  FieldDef *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  size_type local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_d8 = non_deprecated_fields;
  GenDocComment(&(struct_def->super_Definition).doc_comment,"",__return_storage_ptr__);
  local_a8 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_70,local_a8,struct_def);
  local_1a8 = __return_storage_ptr__;
  std::operator+(&local_100,"class ",&local_70);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_100);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_180.field_2._M_allocated_capacity = *psVar6;
    local_180.field_2._8_8_ = plVar5[3];
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  }
  else {
    local_180.field_2._M_allocated_capacity = *psVar6;
    local_180._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_180._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_180,_kFb_abi_cxx11_);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_1a0.field_2._M_allocated_capacity = *psVar6;
    local_1a0.field_2._8_8_ = plVar5[3];
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  }
  else {
    local_1a0.field_2._M_allocated_capacity = *psVar6;
    local_1a0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1a0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_e0 = this;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_150 = *puVar7;
    lStack_148 = plVar5[3];
    local_160 = &local_150;
  }
  else {
    local_150 = *puVar7;
    local_160 = (ulong *)*plVar5;
  }
  local_158 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_160);
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  local_d0 = struct_def;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  local_158 = 0;
  local_150 = local_150 & 0xffffffffffffff00;
  ppVar9 = (local_d8->
           super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_160 = &local_150;
  if (ppVar9 != (local_d8->
                super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    this_01 = local_e0;
    do {
      pFVar2 = ppVar9->second;
      (*(local_a8->super_Namer)._vptr_Namer[0x12])(&local_1a0,local_a8,pFVar2);
      local_80 = ppVar9;
      local_78 = pFVar2;
      getDefaultValue_abi_cxx11_(&local_180,this_01,&pFVar2->value);
      sVar3 = local_180._M_string_length;
      current_namespace = (local_d0->super_Definition).defined_namespace;
      bVar1 = local_d0->fixed;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"T","");
      pFVar4 = local_78;
      this_01 = local_e0;
      GenDartTypeName(&local_100,local_e0,&(pFVar2->value).type,current_namespace,local_78,
                      (bool)((bVar1 ^ 1U) & sVar3 == 0),&local_a0);
      __return_storage_ptr__ = local_1a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      GenDocComment(&(pFVar4->super_Definition).doc_comment,"  ",__return_storage_ptr__);
      std::operator+(&local_c8,"  ",&local_100);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_120 = &local_110;
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_110 = *plVar8;
        lStack_108 = plVar5[3];
      }
      else {
        local_110 = *plVar8;
        local_120 = (long *)*plVar5;
      }
      local_118 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_120,(ulong)local_1a0._M_dataplus._M_p);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_140.field_2._M_allocated_capacity = *psVar6;
        local_140.field_2._8_8_ = plVar5[3];
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar6;
        local_140._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_140._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_140);
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_1c8.field_2._M_allocated_capacity = *psVar6;
        local_1c8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_1c8.field_2._M_allocated_capacity = *psVar6;
        local_1c8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_1c8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_1c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (local_158 != 0) {
        std::__cxx11::string::append((char *)&local_160);
      }
      std::__cxx11::string::append((char *)&local_160);
      std::__cxx11::string::append((char *)&local_160);
      std::operator+(&local_1c8,"this.",&local_1a0);
      std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_1c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((local_d0->fixed == false) && (local_180._M_string_length != 0)) {
        this_00 = (pFVar4->value).type.enum_def;
        if ((this_00 == (EnumDef *)0x0) || (9 < (pFVar4->value).type.base_type - BASE_TYPE_UTYPE)) {
          std::operator+(&local_1c8," = ",&local_180);
          std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_1c8._M_dataplus._M_p);
          uVar10 = local_1c8.field_2._M_allocated_capacity;
          _Var11._M_p = local_1c8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) goto LAB_001ce8a6;
        }
        else {
          v = EnumDef::FindByValue(this_00,&local_180);
          if (v == (EnumVal *)0x0) {
            (*(local_a8->super_Namer)._vptr_Namer[0xf])(local_50,local_a8,this_00);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x366a81);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            psVar6 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_c8.field_2._M_allocated_capacity = *psVar6;
              local_c8.field_2._8_8_ = plVar5[3];
            }
            else {
              local_c8.field_2._M_allocated_capacity = *psVar6;
              local_c8._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_c8._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
            local_120 = &local_110;
            plVar8 = plVar5 + 2;
            if ((long *)*plVar5 == plVar8) {
              local_110 = *plVar8;
              lStack_108 = plVar5[3];
            }
            else {
              local_110 = *plVar8;
              local_120 = (long *)*plVar5;
            }
            local_118 = plVar5[1];
            *plVar5 = (long)plVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_120,(ulong)local_180._M_dataplus._M_p);
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            psVar6 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_140.field_2._M_allocated_capacity = *psVar6;
              local_140.field_2._8_8_ = plVar5[3];
            }
            else {
              local_140.field_2._M_allocated_capacity = *psVar6;
              local_140._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_140._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_140);
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            psVar6 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_1c8.field_2._M_allocated_capacity = *psVar6;
              local_1c8.field_2._8_8_ = plVar5[3];
            }
            else {
              local_1c8.field_2._M_allocated_capacity = *psVar6;
              local_1c8._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_1c8._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_1c8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_120 != &local_110) {
              operator_delete(local_120,local_110 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            uVar10 = local_40[0];
            _Var11._M_p = (pointer)local_50[0];
            if (local_50[0] !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40) goto LAB_001ce8a6;
          }
          else {
            IdlNamer::EnumVariant_abi_cxx11_(&local_140,local_a8,this_00,v);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,0x367d2a)
            ;
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            psVar6 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_1c8.field_2._M_allocated_capacity = *psVar6;
              local_1c8.field_2._8_8_ = plVar5[3];
            }
            else {
              local_1c8.field_2._M_allocated_capacity = *psVar6;
              local_1c8._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_1c8._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_1c8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            uVar10 = local_140.field_2._M_allocated_capacity;
            _Var11._M_p = local_140._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
LAB_001ce8a6:
              operator_delete(_Var11._M_p,uVar10 + 1);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      ppVar9 = local_80 + 1;
    } while (ppVar9 != (local_d8->
                       super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    if (local_158 != 0) {
      std::operator+(&local_1c8,"\n  ",&local_70);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_1c8);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_100.field_2._M_allocated_capacity = *psVar6;
        local_100.field_2._8_8_ = plVar5[3];
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      }
      else {
        local_100.field_2._M_allocated_capacity = *psVar6;
        local_100._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_100._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_160);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_180.field_2._M_allocated_capacity = *psVar6;
        local_180.field_2._8_8_ = plVar5[3];
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      }
      else {
        local_180.field_2._M_allocated_capacity = *psVar6;
        local_180._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_180._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_1a0.field_2._M_allocated_capacity = *psVar6;
        local_1a0.field_2._8_8_ = plVar5[3];
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      }
      else {
        local_1a0.field_2._M_allocated_capacity = *psVar6;
        local_1a0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_1a0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_1a0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  GenStructObjectAPIPack_abi_cxx11_(&local_1a0,local_e0,local_d0,local_d8);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  GenToString(&local_1a0,local_e0,&local_70,local_d8);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenStructObjectAPI(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields) {
    std::string code;
    GenDocComment(struct_def.doc_comment, "", code);

    std::string object_type = namer_.ObjectType(struct_def);
    code += "class " + object_type + " implements " + _kFb + ".Packable {\n";

    std::string constructor_args;
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;

      const std::string field_name = namer_.Field(field);
      const std::string defaultValue = getDefaultValue(field.value);
      const std::string type_name =
          GenDartTypeName(field.value.type, struct_def.defined_namespace, field,
                          defaultValue.empty() && !struct_def.fixed, "T");

      GenDocComment(field.doc_comment, "  ", code);
      code += "  " + type_name + " " + field_name + ";\n";

      if (!constructor_args.empty()) constructor_args += ",\n";
      constructor_args += "      ";
      constructor_args += (struct_def.fixed ? "required " : "");
      constructor_args += "this." + field_name;
      if (!struct_def.fixed && !defaultValue.empty()) {
        if (IsEnum(field.value.type)) {
          auto &enum_def = *field.value.type.enum_def;
          if (auto val = enum_def.FindByValue(defaultValue)) {
            constructor_args += " = " + namer_.EnumVariant(enum_def, *val);
          } else {
            constructor_args += " = const " + namer_.Type(enum_def) + "._(" +
                                defaultValue + ")";
          }
        } else {
          constructor_args += " = " + defaultValue;
        }
      }
    }

    if (!constructor_args.empty()) {
      code += "\n  " + object_type + "({\n" + constructor_args + "});\n\n";
    }

    code += GenStructObjectAPIPack(struct_def, non_deprecated_fields);
    code += "\n";
    code += GenToString(object_type, non_deprecated_fields);

    code += "}\n\n";
    return code;
  }